

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numparse_stringsegment.cpp
# Opt level: O3

UChar32 __thiscall icu_63::numparse::impl::StringSegment::getCodePoint(StringSegment *this)

{
  short sVar1;
  UChar32 UVar2;
  uint uVar3;
  char16_t *pcVar4;
  uint uVar5;
  uint uVar6;
  
  uVar3 = this->fStart;
  sVar1 = (this->fStr).fUnion.fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    uVar6 = (this->fStr).fUnion.fFields.fLength;
  }
  else {
    uVar6 = (int)sVar1 >> 5;
  }
  uVar5 = 0xffff;
  if (uVar3 < uVar6) {
    if (((int)sVar1 & 2U) == 0) {
      pcVar4 = (this->fStr).fUnion.fFields.fArray;
    }
    else {
      pcVar4 = (char16_t *)((long)&(this->fStr).fUnion + 2);
    }
    uVar5 = (uint)(ushort)pcVar4[(int)uVar3];
    if (((uVar5 & 0xfc00) == 0xd800) && ((int)(uVar3 + 1) < this->fEnd)) {
      UVar2 = UnicodeString::char32At(&this->fStr,uVar3);
      return UVar2;
    }
  }
  uVar3 = 0xffffffff;
  if ((uVar5 & 0xf800) != 0xd800) {
    uVar3 = uVar5;
  }
  return uVar3;
}

Assistant:

UChar32 StringSegment::getCodePoint() const {
    char16_t lead = fStr.charAt(fStart);
    if (U16_IS_LEAD(lead) && fStart + 1 < fEnd) {
        return fStr.char32At(fStart);
    } else if (U16_IS_SURROGATE(lead)) {
        return -1;
    } else {
        return lead;
    }
}